

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O3

void __thiscall MultiANN::AddPoint(MultiANN *this,ANNpoint x_coor,void *x_ptr)

{
  int iVar1;
  int iVar2;
  ANNpoint pAVar3;
  uint uVar4;
  long lVar5;
  
  iVar1 = this->dimension;
  iVar2 = this->size;
  if (0 < (long)iVar1) {
    pAVar3 = this->points_coor[iVar2];
    lVar5 = 0;
    do {
      pAVar3[lVar5] = x_coor[lVar5];
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  this->points_ptr[iVar2] = x_ptr;
  uVar4 = iVar2 + 1;
  this->size = uVar4;
  if (((uVar4 & 0xf) == 0) && (uVar4 != this->LastNodeCount)) {
    this->LastNodeCount = uVar4;
    UpdateAnnArray(this);
    return;
  }
  return;
}

Assistant:

void MultiANN::AddPoint(  // dynamic update of the data points
    ANNpoint x_coor,      // coordinates of the point
    void *x_ptr)          // pointer to the point
{
    for (int i = 0; i < dimension; i++) {
        points_coor[size][i] = x_coor[i];
    }
    points_ptr[size] = (void *)x_ptr;
    size++;

    if ((size != LastNodeCount) &&
        (size % ((int)pow((double)2, ANN_STARTING_INDEX)) ==
         0)) {  // Check if it is time to update the ANNs
        LastNodeCount = size;
        UpdateAnnArray();
    }
}